

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nes_apu.c
# Opt level: O1

void apu_square(nesapu_state *info,square_t *chan)

{
  byte bVar1;
  uint32 uVar2;
  int iVar3;
  byte bVar4;
  ulong uVar5;
  byte bVar6;
  float fVar7;
  
  if ((chan->enabled == true) && (chan->Muted != true)) {
    bVar1 = chan->regs[0];
    uVar5 = (ulong)(bVar1 & 0xf);
    uVar2 = info->sync_times1[uVar5];
    fVar7 = chan->env_phase + -4.0;
    chan->env_phase = fVar7;
    if (fVar7 < 0.0) {
      do {
        if ((bVar1 & 0x20) == 0) {
          if (chan->env_vol < 0xf) {
            bVar4 = chan->env_vol + 1;
            goto LAB_0016069f;
          }
        }
        else {
          bVar4 = chan->env_vol + 1 & 0xf;
LAB_0016069f:
          chan->env_vol = bVar4;
        }
        fVar7 = fVar7 + (float)(int)uVar2;
      } while (fVar7 < 0.0);
      chan->env_phase = fVar7;
    }
    if ((bVar1 & 0x20) == 0 && 0 < chan->vbl_length) {
      chan->vbl_length = chan->vbl_length + -1;
    }
    if (chan->vbl_length != 0) {
      bVar4 = chan->regs[1];
      if ((bVar4 & 7) != 0 && (char)bVar4 < '\0') {
        iVar3 = *(int *)((long)info->sync_times1 + (ulong)(bVar4 >> 2 & 0x1c));
        fVar7 = chan->sweep_phase + -2.0;
        chan->sweep_phase = fVar7;
        if (fVar7 < 0.0) {
          do {
            if ((bVar4 & 8) == 0) {
              chan->freq = (chan->freq >> (bVar4 & 7)) + chan->freq;
            }
            else {
              chan->freq = chan->freq - (chan->freq >> (bVar4 & 7));
            }
            fVar7 = fVar7 + (float)iVar3;
          } while (fVar7 < 0.0);
          chan->sweep_phase = fVar7;
        }
      }
      if ((bVar4 & 8) == 0) {
        bVar6 = 7;
        if ((char)bVar4 < '\0') {
          bVar6 = bVar4 & 7;
        }
        if (freq_limit[bVar6] < (int)*(short *)((long)&chan->freq + 2)) goto LAB_0016079c;
      }
      if (0x3ffff < chan->freq) {
        fVar7 = chan->phaseacc - info->apu_incsize;
        chan->phaseacc = fVar7;
        if (fVar7 < 0.0) {
          bVar4 = chan->adder;
          do {
            fVar7 = fVar7 + (float)((uint)chan->freq >> 0x10);
            bVar4 = bVar4 + 1 & 0xf;
          } while (fVar7 < 0.0);
          chan->phaseacc = fVar7;
          chan->adder = bVar4;
        }
        if ((bVar1 & 0x10) == 0) {
          uVar5 = (ulong)(byte)(0xf - chan->env_vol);
        }
        chan->output = (int8)uVar5;
        if (((uint)duty_lut[bVar1 >> 6] >> ((byte)(7 - (chan->adder >> 1)) & 0x1f) & 1) != 0) {
          chan->output = -chan->output;
        }
        return;
      }
    }
  }
LAB_0016079c:
  chan->output = '\0';
  return;
}

Assistant:

static void apu_square(nesapu_state *info, square_t *chan)
{
	int env_delay;
	int sweep_delay;
	uint8 freq_index;

	/* reg0: 0-3=volume, 4=envelope, 5=hold, 6-7=duty cycle
	** reg1: 0-2=sweep shifts, 3=sweep inc/dec, 4-6=sweep length, 7=sweep on
	** reg2: 8 bits of freq
	** reg3: 0-2=high freq, 7-4=vbl length counter
	*/

	if (!chan->enabled || chan->Muted)
	{
		chan->output = 0;
		return;
	}

	/* enveloping */
	env_delay = info->sync_times1[chan->regs[0] & 0x0f];

	/* decay is at a rate of (env_regs + 1) / 240 secs */
	chan->env_phase -= 4;
	while (chan->env_phase < 0)
	{
		chan->env_phase += env_delay;
		if (chan->regs[0] & 0x20)
			chan->env_vol = (chan->env_vol + 1) & 15;
		else if (chan->env_vol < 15)
			chan->env_vol++;
	}

	/* vbl length counter */
	if (chan->vbl_length > 0 && !(chan->regs [0] & 0x20))
		chan->vbl_length--;

	if (!chan->vbl_length)
	{
		chan->output = 0;
		return;
	}

	/* freqsweeps */
	if ((chan->regs[1] & 0x80) && (chan->regs[1] & 7))
	{
		sweep_delay = info->sync_times1[(chan->regs[1] >> 4) & 7];
		chan->sweep_phase -= 2;
		while (chan->sweep_phase < 0)
		{
			chan->sweep_phase += sweep_delay;
			if (chan->regs[1] & 8)
				chan->freq -= chan->freq >> (chan->regs[1] & 7);
			else
				chan->freq += chan->freq >> (chan->regs[1] & 7);
		}
	}

	// Thanks to Delek for the fix
	if (chan->regs[1] & 0x80)
		freq_index = chan->regs[1] & 7;	//If sweeping is enabled, I choose it as normal.
	else
		freq_index = 7;	//If sweeping is disabled, I choose the lower limit.
	//if ((!(chan->regs[1] & 8) && (chan->freq >> 16) > freq_limit[chan->regs[1] & 7])	// original
	if ((!(chan->regs[1] & 8) && (chan->freq >> 16) > freq_limit[freq_index])	// fixed
		 || (chan->freq >> 16) < 4)
	{
		chan->output = 0;
		return;
	}

	chan->phaseacc -= (float) info->apu_incsize; /* # of cycles per sample */

	while (chan->phaseacc < 0)
	{
		chan->phaseacc += (chan->freq >> 16);
		chan->adder = (chan->adder + 1) & 0x0f;
	}

	if (chan->regs[0] & 0x10) /* fixed volume */
		chan->output = chan->regs[0] & 0x0F;
	else
		chan->output = 0x0f - chan->env_vol;

	//BIT( duty_lut[chan->regs[0] >> 6],  7 - BIT(chan->adder, 1, 3) );
	if (duty_lut[chan->regs[0] >> 6] & (1 << (7 - (chan->adder >> 1))))
		chan->output = -chan->output;
}